

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxRectsBinPack.cpp
# Opt level: O2

Rect * __thiscall
rbp::MaxRectsBinPack::Insert
          (Rect *__return_storage_ptr__,MaxRectsBinPack *this,int width,int height,
          FreeRectChoiceHeuristic method)

{
  pointer pRVar1;
  Rect freeNode;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  int score1;
  int score2;
  undefined8 local_48;
  undefined8 uStack_40;
  uint32_t local_38;
  
  score1 = 0x7fffffff;
  score2 = 0x7fffffff;
  switch(method) {
  case RectBestShortSideFit:
    FindPositionForNewNodeBestShortSideFit(__return_storage_ptr__,this,width,height,&score1,&score2)
    ;
    break;
  case RectBestLongSideFit:
    FindPositionForNewNodeBestLongSideFit(__return_storage_ptr__,this,width,height,&score2,&score1);
    break;
  case RectBestAreaFit:
    FindPositionForNewNodeBestAreaFit(__return_storage_ptr__,this,width,height,&score1,&score2);
    break;
  case RectBottomLeftRule:
    FindPositionForNewNodeBottomLeft(__return_storage_ptr__,this,width,height,&score1,&score2);
    break;
  case RectContactPointRule:
    FindPositionForNewNodeContactPoint(__return_storage_ptr__,this,width,height,&score1);
  }
  if (__return_storage_ptr__->height != 0) {
    uVar7 = ((long)(this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x14;
    for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
      pRVar1 = (this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_38 = pRVar1[uVar8].tag;
      pRVar1 = pRVar1 + uVar8;
      local_48._0_4_ = pRVar1->x;
      local_48._4_4_ = pRVar1->y;
      uStack_40._0_4_ = pRVar1->width;
      uStack_40._4_4_ = pRVar1->height;
      uVar2 = pRVar1->x;
      uVar3 = pRVar1->y;
      uVar4 = pRVar1->width;
      uVar5 = pRVar1->height;
      freeNode.height = uVar5;
      freeNode.width = uVar4;
      freeNode.y = uVar3;
      freeNode.x = uVar2;
      freeNode.tag = local_38;
      bVar6 = SplitFreeNode(this,freeNode,__return_storage_ptr__);
      if (bVar6) {
        std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::erase
                  (&this->freeRectangles,
                   (this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar8);
        uVar8 = uVar8 - 1;
        uVar7 = uVar7 - 1;
      }
    }
    PruneFreeList(this);
    std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::push_back
              (&this->usedRectangles,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Rect MaxRectsBinPack::Insert(int width, int height, FreeRectChoiceHeuristic method)
	{
		Rect newNode;
		// Unused in this function. We don't need to know the score after finding the position.
		int score1 = std::numeric_limits<int>::max();
		int score2 = std::numeric_limits<int>::max();
		switch (method)
		{
		case RectBestShortSideFit: newNode = FindPositionForNewNodeBestShortSideFit(width, height, score1, score2);
			break;
		case RectBottomLeftRule: newNode = FindPositionForNewNodeBottomLeft(width, height, score1, score2);
			break;
		case RectContactPointRule: newNode = FindPositionForNewNodeContactPoint(width, height, score1);
			break;
		case RectBestLongSideFit: newNode = FindPositionForNewNodeBestLongSideFit(width, height, score2, score1);
			break;
		case RectBestAreaFit: newNode = FindPositionForNewNodeBestAreaFit(width, height, score1, score2);
			break;
		}

		if (newNode.height == 0)
			return newNode;

		size_t numRectanglesToProcess = freeRectangles.size();
		for (size_t i = 0; i < numRectanglesToProcess; ++i)
		{
			if (SplitFreeNode(freeRectangles[i], newNode))
			{
				freeRectangles.erase(freeRectangles.begin() + i);
				--i;
				--numRectanglesToProcess;
			}
		}

		PruneFreeList();

		usedRectangles.push_back(newNode);
		return newNode;
	}